

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall Units_isBaseUnitsNoImport_Test::TestBody(Units_isBaseUnitsNoImport_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u;
  long *local_60;
  AssertHelper local_58 [8];
  byte local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertionResult local_40;
  long local_30 [2];
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Units::create();
  local_40._0_8_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"some_u","");
  libcellml::NamedEntity::setName(local_20);
  if ((long *)local_40._0_8_ != local_30) {
    operator_delete((void *)local_40._0_8_,local_30[0] + 1);
  }
  bVar1 = libcellml::ImportedEntity::isImport();
  local_50[0] = bVar1 ^ 1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(char *)local_50,"u->isImport()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x833,(char *)local_40._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_40._0_8_ != local_30) {
      operator_delete((void *)local_40._0_8_,local_30[0] + 1);
    }
    if (local_60 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
      local_60 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50[0] = libcellml::Units::isBaseUnit();
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50[0] == 0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(char *)local_50,"u->isBaseUnit()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x834,(char *)local_40._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_40._0_8_ != local_30) {
      operator_delete((void *)local_40._0_8_,local_30[0] + 1);
    }
    if (local_60 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
      local_60 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Units, isBaseUnitsNoImport)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    u->setName("some_u"); // Base unit

    EXPECT_FALSE(u->isImport());
    EXPECT_TRUE(u->isBaseUnit());
}